

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::anon_unknown_4::GLES2Program::GLES2Program(GLES2Program *this,Functions *gl)

{
  ulong uVar1;
  GLint GVar2;
  ulong *__dest;
  long *__dest_00;
  long lVar3;
  size_type __dnew_1;
  size_type __dnew;
  long *local_270;
  long local_268;
  long local_260 [2];
  ulong *local_250;
  ulong local_248;
  ulong local_240 [2];
  Functions *local_230;
  long local_228;
  ulong local_220;
  value_type local_218;
  uint local_1f8;
  value_type local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0 [6];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> vStack_140;
  deUint32 local_128;
  undefined1 local_120 [24];
  undefined1 local_108;
  ProgramSources local_100;
  
  (this->super_Program)._vptr_Program = (_func_int **)&PTR__GLES2Program_02120590;
  this->m_gl = gl;
  memset(local_1d0,0,0xac);
  local_120._0_8_ = (pointer)0x0;
  local_120[8] = 0;
  local_120._9_7_ = 0;
  local_120[0x10] = 0;
  stack0xfffffffffffffef1 = 0;
  local_250 = local_240;
  local_220 = 0xa3;
  __dest = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_250,(ulong)&local_220);
  uVar1 = local_220;
  local_240[0] = local_220;
  local_250 = __dest;
  memcpy(__dest,
         "attribute highp vec4 a_position;\nattribute mediump vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
         ,0xa3);
  local_248 = uVar1;
  *(undefined1 *)((long)__dest + uVar1) = 0;
  local_1f8 = 0;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1f0,local_250,uVar1 + (long)local_250);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_1d0 + local_1f8,&local_1f0);
  local_270 = local_260;
  local_228 = 0x4c;
  __dest_00 = (long *)std::__cxx11::string::_M_create((ulong *)&local_270,(ulong)&local_228);
  lVar3 = local_228;
  local_260[0] = local_228;
  local_270 = __dest_00;
  memcpy(__dest_00,
         "varying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_FragColor = v_color;\n}\n",0x4c);
  local_268 = lVar3;
  *(undefined1 *)((long)__dest_00 + lVar3) = 0;
  local_220 = CONCAT44(local_220._4_4_,1);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_218,local_270,lVar3 + (long)local_270);
  local_230 = gl;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_1d0 + (local_220 & 0xffffffff),&local_218);
  lVar3 = 0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&local_100.sources[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar3),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&local_1d0[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x90);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
            (&local_100.attribLocationBindings,&vStack_140);
  local_100.transformFeedbackBufferMode = local_128;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_100.transformFeedbackVaryings,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_120);
  local_100.separable = (bool)local_108;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_270 != local_260) {
    operator_delete(local_270,local_260[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (local_250 != local_240) {
    operator_delete(local_250,local_240[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_120);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&vStack_140);
  lVar3 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_1d0[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  glu::ShaderProgram::ShaderProgram(&this->m_program,local_230,&local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar3 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  this->m_positionLoc = 0;
  this->m_colorLoc = 0;
  GVar2 = (*this->m_gl->getAttribLocation)((this->m_program).m_program.m_program,"a_position");
  this->m_positionLoc = GVar2;
  GVar2 = (*this->m_gl->getAttribLocation)((this->m_program).m_program.m_program,"a_color");
  this->m_colorLoc = GVar2;
  return;
}

Assistant:

GLES2Program (const glw::Functions& gl)
		: m_gl				(gl)
		, m_program			(gl, getProgramSourcesES2())
		, m_positionLoc		(0)
		, m_colorLoc		(0)
	{

		m_positionLoc	= m_gl.getAttribLocation(m_program.getProgram(), "a_position");
		m_colorLoc		= m_gl.getAttribLocation(m_program.getProgram(), "a_color");
	}